

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

void whisper_log_callback_default(ggml_log_level level,char *text,void *user_data)

{
  if (level == GGML_LOG_LEVEL_DEBUG) {
    return;
  }
  whisper_log_callback_default();
  return;
}

Assistant:

static void whisper_log_callback_default(ggml_log_level level, const char * text, void * user_data) {
    (void) level;
    (void) user_data;
#ifndef WHISPER_DEBUG
    if (level == GGML_LOG_LEVEL_DEBUG) {
        return;
    }
#endif
    fputs(text, stderr);
    fflush(stderr);
}